

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O1

bool __thiscall absl::synchronization_internal::GraphCycles::CheckInvariants(GraphCycles *this)

{
  uint uVar1;
  Rep *pRVar2;
  Node *pNVar3;
  Node *pNVar4;
  bool bVar5;
  uint uVar6;
  uint unaff_EBX;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  NodeSet ranks;
  ulong uVar11;
  
  pRVar2 = this->rep_;
  anon_unknown_0::NodeSet::NodeSet(&ranks);
  if ((pRVar2->nodes_).size_ != 0) {
    uVar7 = 0;
    do {
      pNVar3 = (pRVar2->nodes_).ptr_[uVar7];
      if (pNVar3->masked_ptr != 0xf03a5f7bf03a5f7b) {
        uVar9 = pNVar3->masked_ptr ^ 0xf03a5f7bf03a5f7b;
        uVar6 = (pRVar2->ptrmap_).table_._M_elems
                [(uint)((int)uVar9 + (int)(uVar9 / 0x1feb) * -0x1feb)];
        while (uVar6 != 0xffffffff) {
          pNVar4 = ((pRVar2->ptrmap_).nodes_)->ptr_[uVar6];
          uVar8 = (ulong)uVar6;
          if ((pNVar4->masked_ptr ^ uVar9) == 0xf03a5f7bf03a5f7b) goto LAB_0014c6b9;
          uVar6 = pNVar4->next_hash;
        }
        uVar8 = 0xffffffff;
LAB_0014c6b9:
        if (uVar7 != uVar8) {
          raw_logging_internal::RawLog
                    (kFatal,"graphcycles.cc",0x183,"Did not find live node in hash table %u %p",
                     uVar7 & 0xffffffff);
        }
      }
      if (pNVar3->visited == true) {
        raw_logging_internal::RawLog
                  (kFatal,"graphcycles.cc",0x186,"Did not clear visited marker on node %u",
                   uVar7 & 0xffffffff);
      }
      bVar5 = anon_unknown_0::NodeSet::insert(&ranks,pNVar3->rank);
      if (!bVar5) {
        raw_logging_internal::RawLog
                  (kFatal,"graphcycles.cc",0x189,"Duplicate occurrence of rank %d",
                   (ulong)(uint)pNVar3->rank);
      }
      uVar9 = 0;
      uVar6 = unaff_EBX;
LAB_0014c742:
      uVar1 = (pNVar3->out).table_.size_;
      uVar8 = (ulong)uVar1;
      uVar11 = uVar9;
      if (uVar1 < (uint)uVar9) {
        uVar8 = uVar9;
      }
      do {
        uVar10 = (uint)uVar11;
        uVar9 = uVar8;
        unaff_EBX = uVar6;
        if ((uint)uVar8 == uVar10) break;
        unaff_EBX = (pNVar3->out).table_.ptr_[uVar11];
        uVar9 = (ulong)(uVar10 + 1);
        uVar11 = uVar9;
      } while ((int)unaff_EBX < 0);
      if (uVar10 < uVar1) {
        uVar1 = (pRVar2->nodes_).ptr_[unaff_EBX]->rank;
        uVar6 = unaff_EBX;
        if ((int)uVar1 <= pNVar3->rank) {
          raw_logging_internal::RawLog
                    (kFatal,"graphcycles.cc",399,"Edge %u->%d has bad rank assignment %d->%d",
                     uVar7 & 0xffffffff,(ulong)unaff_EBX,(ulong)(uint)pNVar3->rank,(ulong)uVar1);
        }
        goto LAB_0014c742;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < (pRVar2->nodes_).size_);
  }
  anon_unknown_0::Vec<int>::~Vec(&ranks.table_);
  return true;
}

Assistant:

bool GraphCycles::CheckInvariants() const {
  Rep* r = rep_;
  NodeSet ranks;  // Set of ranks seen so far.
  for (uint32_t x = 0; x < r->nodes_.size(); x++) {
    Node* nx = r->nodes_[x];
    void* ptr = base_internal::UnhidePtr<void>(nx->masked_ptr);
    if (ptr != nullptr && static_cast<uint32_t>(r->ptrmap_.Find(ptr)) != x) {
      ABSL_RAW_LOG(FATAL, "Did not find live node in hash table %u %p", x, ptr);
    }
    if (nx->visited) {
      ABSL_RAW_LOG(FATAL, "Did not clear visited marker on node %u", x);
    }
    if (!ranks.insert(nx->rank)) {
      ABSL_RAW_LOG(FATAL, "Duplicate occurrence of rank %d", nx->rank);
    }
    HASH_FOR_EACH(y, nx->out) {
      Node* ny = r->nodes_[y];
      if (nx->rank >= ny->rank) {
        ABSL_RAW_LOG(FATAL, "Edge %u->%d has bad rank assignment %d->%d", x, y,
                     nx->rank, ny->rank);
      }
    }
  }
  return true;
}